

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O2

int file_stdio_fungetc(ALLEGRO_FILE *f,int c)

{
  int errnum;
  int iVar1;
  USERDATA *pUVar2;
  int *piVar3;
  
  pUVar2 = get_userdata(f);
  iVar1 = ungetc(c,(FILE *)pUVar2->fp);
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    errnum = *piVar3;
    pUVar2->errnum = errnum;
    al_set_errno(errnum);
  }
  return iVar1;
}

Assistant:

static int file_stdio_fungetc(ALLEGRO_FILE *f, int c)
{
   USERDATA *userdata = get_userdata(f);
   int rc;

   rc = ungetc(c, userdata->fp);
   if (rc == EOF) {
      userdata->errnum = errno;
      al_set_errno(errno);
   }

   return rc;
}